

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

void __thiscall ON_PointCloud::Destroy(ON_PointCloud *this)

{
  ON_PointCloud *this_local;
  
  ON_SimpleArray<bool>::Destroy(&this->m_H);
  ON_SimpleArray<ON_Color>::Destroy(&this->m_C);
  ON_SimpleArray<double>::Destroy(&this->m_V);
  ON_SimpleArray<ON_3dVector>::Destroy(&this->m_N);
  ON_SimpleArray<ON_3dPoint>::Destroy(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
  this->m_hidden_count = 0;
  this->m_flags = 0;
  ON_BoundingBox::Destroy(&this->m_bbox);
  return;
}

Assistant:

void ON_PointCloud::Destroy()
{
  m_H.Destroy();
  m_C.Destroy();
  m_V.Destroy();
  m_N.Destroy();
  m_P.Destroy();
  m_hidden_count=0;
  m_flags = 0;
  m_bbox.Destroy();
}